

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O2

int __thiscall dg::BBlock<dg::LLVMNode>::remove(BBlock<dg::LLVMNode> *this,char *__filename)

{
  LLVMNode *n;
  int extraout_EAX;
  _List_node_base *p_Var1;
  
  isolate(this);
  if ((DependenceGraph<dg::LLVMNode> *)this->dg != (DependenceGraph<dg::LLVMNode> *)0x0) {
    DependenceGraph<dg::LLVMNode>::removeBlock((DependenceGraph<dg::LLVMNode> *)this->dg,this->key);
    if (*(BBlock<dg::LLVMNode> **)(this->dg + 0x90) == this) {
      *(undefined8 *)(this->dg + 0x90) = 0;
    }
  }
  if ((char)__filename != '\0') {
    p_Var1 = (_List_node_base *)&this->nodes;
    while (p_Var1 = (((_List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                     &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&this->nodes) {
      n = (LLVMNode *)p_Var1[1]._M_next;
      (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).basicBlock =
           (BBlock<dg::LLVMNode> *)0x0;
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeCDs
                ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)n);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeDDs
                ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)n);
      DependenceGraph<dg::LLVMNode>::removeNode
                ((DependenceGraph<dg::LLVMNode> *)
                 (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg,n);
      LLVMNode::~LLVMNode(n);
      operator_delete(n,0x1f0);
    }
  }
  ~BBlock(this);
  operator_delete(this,0x208);
  return extraout_EAX;
}

Assistant:

void remove(bool with_nodes = true) {
        // do not leave any dangling reference
        isolate();

        if (dg) {
#ifndef NDEBUG
            bool ret =
#endif
                    dg->removeBlock(key);
            assert(ret && "BUG: block was not in DG");
            if (dg->getEntryBB() == this)
                dg->setEntryBB(nullptr);
        }

        if (with_nodes) {
            for (NodeT *n : nodes) {
                // we must set basic block to nullptr
                // otherwise the node will try to remove the
                // basic block again if it is of size 1
                n->setBasicBlock(nullptr);

                // remove dependency edges, let be CFG edges
                // as we'll destroy all the nodes
                n->removeCDs();
                n->removeDDs();
                // remove the node from dg
                assert(n->getDG());
                n->getDG()->removeNode(n);

                delete n;
            }
        }

        delete this;
    }